

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<8,_embree::TriangleMi<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<8,_embree::TriangleMi<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  FastAllocator *this_00;
  ThreadLocal *pTVar8;
  ThreadLocal2 *this_01;
  iterator __position;
  TriangleMesh *pTVar9;
  BuildPrim *pBVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  size_t sVar19;
  ulong uVar20;
  uint uVar21;
  size_t i;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  size_t __n;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar31;
  vuint4 v0;
  vuint4 v1;
  vuint4 vgeomID;
  vuint4 v2;
  vuint4 vprimID;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_68;
  undefined1 local_58 [16];
  ulong local_40;
  NodeRecord *local_38;
  
  local_78._8_8_ = local_78._0_8_;
  uVar21 = current->_begin;
  local_68.m128[0] = (float)current->_end;
  this_00 = alloc->alloc;
  pTVar8 = alloc->talloc1;
  local_98._8_8_ = local_98._0_8_;
  local_98._0_8_ = 0x50;
  this_01 = pTVar8->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_a8[8] = 1;
    local_a8._0_8_ = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_88._0_8_ = this_01;
    local_b8[8] = 1;
    local_b8._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)local_88);
    }
    else {
      *__position._M_current = this_01;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_a8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_a8._0_8_);
    }
  }
  uVar23 = (ulong)(local_68._0_4_ - uVar21);
  uVar18 = local_98._0_8_;
  pTVar8->bytesUsed = pTVar8->bytesUsed + local_98._0_8_;
  sVar19 = pTVar8->cur;
  uVar20 = (ulong)(-(int)sVar19 & 0xf);
  uVar26 = sVar19 + local_98._0_8_ + uVar20;
  pTVar8->cur = uVar26;
  local_38 = __return_storage_ptr__;
  if (pTVar8->end < uVar26) {
    local_78._0_8_ = this;
    pTVar8->cur = sVar19;
    uVar20 = pTVar8->allocBlockSize;
    if ((ulong)(local_98._0_8_ * 4) < uVar20 || local_98._0_8_ * 4 - uVar20 == 0) {
      local_b8._0_8_ = uVar20;
      pauVar27 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_b8);
      pTVar8->ptr = (char *)pauVar27;
      sVar19 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
      pTVar8->bytesWasted = sVar19;
      pTVar8->end = local_b8._0_8_;
      pTVar8->cur = uVar18;
      if ((ulong)local_b8._0_8_ < (ulong)uVar18) {
        pTVar8->cur = 0;
        local_b8._0_8_ = pTVar8->allocBlockSize;
        pauVar27 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_b8);
        pTVar8->ptr = (char *)pauVar27;
        sVar19 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
        pTVar8->bytesWasted = sVar19;
        pTVar8->end = local_b8._0_8_;
        pTVar8->cur = uVar18;
        if ((ulong)local_b8._0_8_ < (ulong)uVar18) {
          pTVar8->cur = 0;
          pauVar27 = (undefined1 (*) [16])0x0;
          this = (CreateMortonLeaf<8,_embree::TriangleMi<4>_> *)local_78._0_8_;
          goto LAB_0147de78;
        }
      }
      pTVar8->bytesWasted = sVar19;
      this = (CreateMortonLeaf<8,_embree::TriangleMi<4>_> *)local_78._0_8_;
    }
    else {
      pauVar27 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_98);
      this = (CreateMortonLeaf<8,_embree::TriangleMi<4>_> *)local_78._0_8_;
    }
  }
  else {
    pTVar8->bytesWasted = pTVar8->bytesWasted + uVar20;
    pauVar27 = (undefined1 (*) [16])(pTVar8->ptr + (uVar26 - local_98._0_8_));
  }
LAB_0147de78:
  local_b8 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
  local_58 = local_98;
  local_40 = uVar23;
  if (local_68._0_4_ == uVar21) {
    local_78.m128[2] = INFINITY;
    local_78._0_8_ = 0x7f8000007f800000;
    local_78.m128[3] = INFINITY;
    local_68.m128[2] = -INFINITY;
    local_68._0_8_ = 0xff800000ff800000;
    local_68.m128[3] = -INFINITY;
  }
  else {
    pTVar9 = this->mesh;
    pBVar10 = this->morton;
    lVar11 = *(long *)&(pTVar9->super_Geometry).field_0x58;
    lVar12 = *(long *)&pTVar9->field_0x68;
    pcVar13 = (pTVar9->vertices0).super_RawBufferView.ptr_ofs;
    uVar20 = (pTVar9->vertices0).super_RawBufferView.stride;
    uVar3 = this->geomID_;
    uVar22 = (uint)(uVar20 >> 2) & 0x3fffffff;
    aVar30.m128[2] = -INFINITY;
    aVar30._0_8_ = 0xff800000ff800000;
    aVar30.m128[3] = -INFINITY;
    aVar31.m128[2] = INFINITY;
    aVar31._0_8_ = 0x7f8000007f800000;
    aVar31.m128[3] = INFINITY;
    lVar24 = 0;
    do {
      uVar4 = *(uint *)((long)&pBVar10[uVar21].field_0 + lVar24 * 2 + 4);
      lVar25 = (ulong)uVar4 * lVar12;
      uVar5 = *(uint *)(lVar11 + lVar25);
      uVar6 = *(uint *)(lVar11 + 4 + lVar25);
      uVar7 = *(uint *)(lVar11 + 8 + lVar25);
      auVar14 = vminps_avx((undefined1  [16])aVar31,*(undefined1 (*) [16])(pcVar13 + uVar5 * uVar20)
                          );
      auVar15 = vminps_avx(*(undefined1 (*) [16])(pcVar13 + uVar6 * uVar20),
                           *(undefined1 (*) [16])(pcVar13 + uVar7 * uVar20));
      aVar31 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx((undefined1  [16])aVar30,*(undefined1 (*) [16])(pcVar13 + uVar5 * uVar20)
                          );
      auVar15 = vmaxps_avx(*(undefined1 (*) [16])(pcVar13 + uVar6 * uVar20),
                           *(undefined1 (*) [16])(pcVar13 + uVar7 * uVar20));
      aVar30 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vmaxps_avx(auVar14,auVar15);
      *(uint *)(local_98 + lVar24) = uVar3;
      *(uint *)(local_58 + lVar24) = uVar4;
      *(uint *)(local_b8 + lVar24) = uVar22 * uVar5;
      *(uint *)(local_a8 + lVar24) = uVar6 * uVar22;
      *(uint *)(local_88 + lVar24) = uVar7 * uVar22;
      lVar24 = lVar24 + 4;
      local_78 = aVar31;
      local_68 = aVar30;
    } while ((uVar23 + (uVar23 == 0)) * 4 != lVar24);
  }
  uVar20 = local_40;
  uVar21 = (uint)local_40;
  if (uVar21 < 4) {
    __n = local_40 * -4 + 0x10;
    memset(local_58 + local_40 * 4,0xff,__n);
    memset(local_b8 + uVar20 * 4,0,__n);
    memset(local_a8 + uVar20 * 4,0,__n);
    memset(local_88 + uVar20 * 4,0,__n);
    auVar28._4_4_ = local_98._0_4_;
    auVar28._0_4_ = local_98._0_4_;
    auVar28._8_4_ = local_98._0_4_;
    auVar28._12_4_ = local_98._0_4_;
    auVar28._16_4_ = local_98._0_4_;
    auVar28._20_4_ = local_98._0_4_;
    auVar28._24_4_ = local_98._0_4_;
    auVar28._28_4_ = local_98._0_4_;
    auVar17 = vpshufd_avx(ZEXT416(3 - uVar21),0x44);
    auVar14 = vpcmpgtq_avx(auVar17,_DAT_01fdd650);
    auVar15 = vpcmpgtq_avx(auVar17,_DAT_01fdd660);
    auVar16 = vpcmpgtq_avx(auVar17,_DAT_01fdd670);
    auVar14 = vpackssdw_avx(auVar15,auVar14);
    auVar15 = vpcmpgtq_avx(auVar17,_DAT_01fdd680);
    auVar15 = vpackssdw_avx(auVar15,auVar16);
    auVar14 = vpackssdw_avx(auVar15,auVar14);
    auVar15 = vpmovsxwd_avx(auVar14);
    auVar14 = vpunpckhwd_avx(auVar14,auVar14);
    auVar29._16_16_ = auVar14;
    auVar29._0_16_ = auVar15;
    auVar28 = vmaskmovps_avx(auVar29,auVar28);
    *(undefined1 (*) [32])(local_98 + uVar20 * 4) = auVar28;
  }
  auVar14 = vmovntps_avx(local_b8);
  *pauVar27 = auVar14;
  auVar14 = vmovntps_avx(local_a8);
  pauVar27[1] = auVar14;
  auVar14 = vmovntps_avx(local_88);
  pauVar27[2] = auVar14;
  auVar14 = vmovntps_avx(local_98);
  pauVar27[3] = auVar14;
  auVar14 = vmovntps_avx(local_58);
  pauVar27[4] = auVar14;
  (local_38->ref).ptr = (ulong)pauVar27 | 9;
  (local_38->bounds).lower.field_0 = local_78;
  (local_38->bounds).upper.field_0 = local_68;
  return local_38;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4i* accel = (Triangle4i*) alloc.malloc1(sizeof(Triangle4i),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        
        vuint4 v0 = zero, v1 = zero, v2 = zero;
        vuint4 vgeomID = -1, vprimID = -1;
        const TriangleMesh* __restrict__ const mesh = this->mesh;
        
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID[i] = geomID_;
          vprimID[i] = primID;
          unsigned int int_stride = mesh->vertices0.getStride()/4;
          v0[i] = tri.v[0] * int_stride; 
          v1[i] = tri.v[1] * int_stride;
          v2[i] = tri.v[2] * int_stride;
        }
        
        for (size_t i=items; i<4; i++)
        {
          vgeomID[i] = vgeomID[0];
          vprimID[i] = -1;
          v0[i] = 0;
          v1[i] = 0; 
          v2[i] = 0;
        }
        Triangle4i::store_nt(accel,Triangle4i(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }